

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSParser::parsePlayListMark(MPLSParser *this,uint8_t *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  unsigned_short ref_to_PlayItem_id;
  uint32_t mark_time_stamp;
  BitStreamReader reader;
  unsigned_short local_56;
  uint local_54;
  BitStreamReader local_50;
  
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  local_50.m_curVal = 0;
  local_50.m_bitLeft = 0;
  BitStream::setBuffer(&local_50.super_BitStream,buffer,buffer + len);
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
  local_50.m_bitLeft = 0x20;
  BitStreamReader::skipBits(&local_50,0x20);
  uVar1 = BitStreamReader::getBits(&local_50,0x10);
  uVar1 = uVar1 & 0xffff;
  if (uVar1 != 0) {
    do {
      BitStreamReader::skipBits(&local_50,8);
      uVar2 = BitStreamReader::getBits(&local_50,8);
      uVar3 = BitStreamReader::getBits(&local_50,0x10);
      local_56 = (unsigned_short)uVar3;
      local_54 = BitStreamReader::getBits(&local_50,0x20);
      BitStreamReader::skipBits(&local_50,0x10);
      BitStreamReader::skipBits(&local_50,0x20);
      if ((char)uVar2 == '\x01') {
        std::vector<PlayListMark,std::allocator<PlayListMark>>::
        emplace_back<unsigned_short_const&,unsigned_int_const&>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,&local_56,
                   &local_54);
      }
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void MPLSParser::parsePlayListMark(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + len);
    reader.skipBits(32);  // length
    const auto number_of_PlayList_marks = reader.getBits<uint16_t>(16);
    for (int PL_mark_id = 0; PL_mark_id < number_of_PlayList_marks; PL_mark_id++)
    {
        reader.skipBits(8);  // reserved_for_future_use
        const auto mark_type = reader.getBits<uint8_t>(8);
        const auto ref_to_PlayItem_id = reader.getBits<uint16_t>(16);
        const uint32_t mark_time_stamp = reader.getBits(32);
        reader.skipBits(16);  // entry_ES_PID
        reader.skipBits(32);  // duration
        if (mark_type == 1)   // mark_type 0x01 = Chapter search
            m_marks.emplace_back(ref_to_PlayItem_id, mark_time_stamp);
    }
}